

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_bmrs.h
# Opt level: O2

void __thiscall BMRS<RemSP>::Dealloc(BMRS<RemSP> *this)

{
  RemSP::Dealloc();
  Runs::Dealloc(&this->data_runs);
  Data_Compressed::Dealloc(&this->data_flags);
  Data_Compressed::Dealloc(&this->data_merged);
  Data_Compressed::Dealloc(&this->data_compressed);
  return;
}

Assistant:

void Dealloc() {
        LabelsSolver::Dealloc();
        data_runs.Dealloc();
        data_flags.Dealloc();
        data_merged.Dealloc();
        data_compressed.Dealloc();
        // No free for img_labels_ because it is required at the end of the algorithm 
    }